

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QString,QDomNodePrivate*>::emplace<QDomNodePrivate*const&>
          (QMultiHash<QString,_QDomNodePrivate_*> *this,QString *key,QDomNodePrivate **args)

{
  long lVar1;
  bool bVar2;
  QMultiHash<QString,_QDomNodePrivate_*> *in_RCX;
  QString *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  QMultiHash<QString,_QDomNodePrivate_*> copy;
  QMultiHash<QString,_QDomNodePrivate_*> *in_stack_ffffffffffffffa8;
  iterator *args_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_00 = in_RDI;
  bVar2 = QMultiHash<QString,_QDomNodePrivate_*>::isDetached
                    ((QMultiHash<QString,_QDomNodePrivate_*> *)in_RDI);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_>::shouldGrow
                      ((Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)(in_RSI->d).d);
    if (bVar2) {
      emplace_helper<QDomNodePrivate*>(in_RCX,in_RSI,(QDomNodePrivate **)args_00);
    }
    else {
      emplace_helper<QDomNodePrivate*const&>(in_RCX,in_RSI,(QDomNodePrivate **)args_00);
    }
  }
  else {
    QMultiHash<QString,_QDomNodePrivate_*>::QMultiHash
              ((QMultiHash<QString,_QDomNodePrivate_*> *)in_RDI,in_stack_ffffffffffffffa8);
    QMultiHash<QString,_QDomNodePrivate_*>::detach((QMultiHash<QString,_QDomNodePrivate_*> *)in_RDI)
    ;
    emplace_helper<QDomNodePrivate*const&>(in_RCX,in_RSI,(QDomNodePrivate **)args_00);
    QMultiHash<QString,_QDomNodePrivate_*>::~QMultiHash
              ((QMultiHash<QString,_QDomNodePrivate_*> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return args_00;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }